

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter_p.h
# Opt level: O2

Error __thiscall asmjit::CodeWriter::ensureSpace(CodeWriter *this,BaseAssembler *a,size_t n)

{
  Error EVar1;
  
  EVar1 = 0;
  if ((ulong)((long)a->_bufferEnd - (long)this->_cursor) < n) {
    EVar1 = CodeHolder::growBuffer((a->super_BaseEmitter)._code,&a->_section->_buffer,n);
    if (EVar1 == 0) {
      this->_cursor = a->_bufferPtr;
      EVar1 = 0;
    }
    else {
      EVar1 = BaseEmitter::reportError(&a->super_BaseEmitter,EVar1,(char *)0x0);
    }
  }
  return EVar1;
}

Assistant:

ASMJIT_INLINE Error ensureSpace(BaseAssembler* a, size_t n) noexcept {
    size_t remainingSpace = (size_t)(a->_bufferEnd - _cursor);
    if (ASMJIT_UNLIKELY(remainingSpace < n)) {
      CodeBuffer& buffer = a->_section->_buffer;
      Error err = a->_code->growBuffer(&buffer, n);
      if (ASMJIT_UNLIKELY(err))
        return a->reportError(err);
      _cursor = a->_bufferPtr;
    }
    return kErrorOk;
  }